

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuConfig.cpp
# Opt level: O0

vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> * __thiscall
xmrig::CpuConfig::get(CpuConfig *this,Miner *miner)

{
  undefined1 uVar1;
  bool bVar2;
  CpuThreads *this_00;
  CpuThread *__args_2;
  vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *__lhs;
  size_type in_RSI;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *in_RDI;
  CpuThread *thread;
  const_iterator __end1;
  const_iterator __begin1;
  vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *__range1;
  CpuThreads *threads;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *out;
  vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff80;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *this_01;
  Threads<xmrig::CpuThreads> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_xmrig::CpuThread_*,_std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>_>
  local_48;
  vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *local_40;
  CpuThreads *local_28;
  undefined1 local_19;
  
  local_19 = 0;
  this_01 = in_RDI;
  std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::vector
            ((vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *)0x2010b3);
  this_00 = Threads<xmrig::CpuThreads>::get(in_stack_ffffffffffffffa0);
  local_28 = this_00;
  uVar1 = CpuThreads::isEmpty((CpuThreads *)0x2010dc);
  if (!(bool)uVar1) {
    __args_2 = (CpuThread *)CpuThreads::count((CpuThreads *)0x201125);
    std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::reserve
              ((vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *)this_00,in_RSI
              );
    __lhs = CpuThreads::data(local_28);
    local_40 = __lhs;
    local_48._M_current =
         (CpuThread *)
         std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::begin
                   (in_stack_ffffffffffffff68);
    std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::end(in_stack_ffffffffffffff68)
    ;
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_xmrig::CpuThread_*,_std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>_>
                               *)__lhs,(__normal_iterator<const_xmrig::CpuThread_*,_std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>_>
                                        *)in_stack_ffffffffffffff68), bVar2) {
      __gnu_cxx::
      __normal_iterator<const_xmrig::CpuThread_*,_std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>_>
      ::operator*(&local_48);
      std::vector<xmrig::CpuLaunchData,std::allocator<xmrig::CpuLaunchData>>::
      emplace_back<xmrig::Miner_const*&,xmrig::CpuConfig_const&,xmrig::CpuThread_const&>
                (this_01,(Miner **)in_RDI,(CpuConfig *)CONCAT17(uVar1,in_stack_ffffffffffffff80),
                 __args_2);
      __gnu_cxx::
      __normal_iterator<const_xmrig::CpuThread_*,_std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>_>
      ::operator++(&local_48);
    }
  }
  return this_01;
}

Assistant:

std::vector<xmrig::CpuLaunchData> xmrig::CpuConfig::get(const Miner *miner) const
{
    std::vector<CpuLaunchData> out;
    const CpuThreads &threads = m_threads.get();

    if (threads.isEmpty()) {
        return out;
    }

    out.reserve(threads.count());

    for (const CpuThread &thread : threads.data()) {
        out.emplace_back(miner, *this, thread);
    }

    return out;
}